

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_get_ushort(AMQP_VALUE value,uint16_t *ushort_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || ushort_value == (uint16_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x163;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_ushort",0x162,1,"Bad arguments: value = %p, ushort_value = %p",value
                ,ushort_value);
    }
  }
  else if (value->type == AMQP_TYPE_USHORT) {
    *ushort_value = (value->value).ushort_value;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x16c;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_ushort",0x16b,1,"Value is not of type USHORT");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_ushort(AMQP_VALUE value, uint16_t* ushort_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_042: [If any of the arguments is NULL then amqpvalue_get_ushort shall return a non-zero value.] */
    if ((value == NULL) ||
        (ushort_value == NULL))
    {
        LogError("Bad arguments: value = %p, ushort_value = %p",
            value, ushort_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_043: [If the type of the value is not ushort (was not created with amqpvalue_create_ushort), then amqpvalue_get_ushort shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_USHORT)
        {
            LogError("Value is not of type USHORT");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_040: [amqpvalue_get_ushort shall fill in the ushort_value argument the uint16_t value stored by the AMQP value indicated by the value argument.] */
            *ushort_value = value_data->value.ushort_value;

            /* Codes_SRS_AMQPVALUE_01_041: [On success amqpvalue_get_ushort shall return 0.] */
            result = 0;
        }
    }

    return result;
}